

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagStackFrame.cpp
# Opt level: O1

ScriptFunction * __thiscall
Js::DiagStackFrame::TryGetFunctionForEval
          (DiagStackFrame *this,ScriptContext *scriptContext,char16 *source,int sourceLength,
          BOOL isLibraryCode)

{
  Type p_Var1;
  BOOL BVar2;
  int iVar3;
  BOOL BVar4;
  undefined4 extraout_var;
  ScriptFunction *pSVar5;
  
  BVar2 = IsThisAvailable(this);
  p_Var1 = ((scriptContext->super_ScriptContextBase).globalObject)->EvalHelper;
  iVar3 = (*this->_vptr_DiagStackFrame[2])(this);
  BVar4 = JavascriptFunction::IsStrictMode((JavascriptFunction *)CONCAT44(extraout_var,iVar3));
  pSVar5 = (*p_Var1)(scriptContext,source,sourceLength,0,
                     (uint)(isLibraryCode != 0) * 0x20000 + (uint)(BVar2 == 0) * 0x200000 + 0x401c02
                     ,L"eval code",0,0,BVar4);
  return pSVar5;
}

Assistant:

Js::ScriptFunction* DiagStackFrame::TryGetFunctionForEval(Js::ScriptContext* scriptContext, const char16 *source, int sourceLength, BOOL isLibraryCode /* = FALSE */)
    {
        // TODO: pass the real length of the source code instead of wcslen
        uint32 grfscr = fscrReturnExpression | fscrEval | fscrEvalCode | fscrGlobalCode | fscrConsoleScopeEval;
        if (!this->IsThisAvailable())
        {
            grfscr |= fscrDebuggerErrorOnGlobalThis;
        }
        if (isLibraryCode)
        {
            grfscr |= fscrIsLibraryCode;
        }
        return scriptContext->GetGlobalObject()->EvalHelper(scriptContext, source, sourceLength, kmodGlobal, grfscr, Js::Constants::EvalCode, FALSE, FALSE, this->IsStrictMode());
    }